

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_reallocstack(lua_State *L,int newsize)

{
  int iVar1;
  StkId block;
  ulong uVar2;
  UpVal *pUVar3;
  StkId pTVar4;
  CallInfo *pCVar5;
  LuaType *pLVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  
  if (newsize != 0xf4308 && 1000000 < newsize) {
    __assert_fail("newsize <= 1000000 || newsize == (1000000 + 200)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0xc3,"void luaD_reallocstack(lua_State *, int)");
  }
  block = L->stack;
  iVar1 = L->stacksize;
  lVar8 = (long)iVar1;
  if ((long)L->stack_last - (long)block >> 4 != lVar8 + -5) {
    __assert_fail("L->stack_last - L->stack == L->stacksize - 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0xc4,"void luaD_reallocstack(lua_State *, int)");
  }
  lVar9 = (long)newsize;
  pTVar4 = (StkId)luaM_realloc_(L,block,lVar8 * 0x10,lVar9 * 0x10);
  L->stack = pTVar4;
  if (iVar1 < newsize) {
    auVar10 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pLVar6 = &pTVar4[lVar8 + 0x1f].tt_;
    uVar7 = 0;
    auVar14 = vpbroadcastq_avx512f();
    do {
      auVar15 = vpbroadcastq_avx512f();
      auVar16 = vporq_avx512f(auVar15,auVar13);
      uVar2 = vpcmpuq_avx512f(auVar16,auVar14,2);
      if ((uVar2 & 1) != 0) {
        pLVar6[-0xf8] = 0;
      }
      if ((uVar2 & 2) != 0) {
        pLVar6[-0xf0] = 0;
      }
      if ((uVar2 & 4) != 0) {
        pLVar6[-0xe8] = 0;
      }
      if ((uVar2 & 8) != 0) {
        pLVar6[-0xe0] = 0;
      }
      if ((uVar2 & 0x10) != 0) {
        pLVar6[-0xd8] = 0;
      }
      if ((uVar2 & 0x20) != 0) {
        pLVar6[-0xd0] = 0;
      }
      if ((uVar2 & 0x40) != 0) {
        pLVar6[-200] = 0;
      }
      if ((uVar2 & 0x80) != 0) {
        pLVar6[-0xc0] = 0;
      }
      auVar16 = vporq_avx512f(auVar15,auVar12);
      uVar2 = vpcmpuq_avx512f(auVar16,auVar14,2);
      if ((uVar2 & 1) != 0) {
        pLVar6[-0xb8] = 0;
      }
      if ((uVar2 & 2) != 0) {
        pLVar6[-0xb0] = 0;
      }
      if ((uVar2 & 4) != 0) {
        pLVar6[-0xa8] = 0;
      }
      if ((uVar2 & 8) != 0) {
        pLVar6[-0xa0] = 0;
      }
      if ((uVar2 & 0x10) != 0) {
        pLVar6[-0x98] = 0;
      }
      if ((uVar2 & 0x20) != 0) {
        pLVar6[-0x90] = 0;
      }
      if ((uVar2 & 0x40) != 0) {
        pLVar6[-0x88] = 0;
      }
      if ((uVar2 & 0x80) != 0) {
        pLVar6[-0x80] = 0;
      }
      auVar16 = vporq_avx512f(auVar15,auVar11);
      uVar2 = vpcmpuq_avx512f(auVar16,auVar14,2);
      if ((uVar2 & 1) != 0) {
        pLVar6[-0x78] = 0;
      }
      if ((uVar2 & 2) != 0) {
        pLVar6[-0x70] = 0;
      }
      if ((uVar2 & 4) != 0) {
        pLVar6[-0x68] = 0;
      }
      if ((uVar2 & 8) != 0) {
        pLVar6[-0x60] = 0;
      }
      if ((uVar2 & 0x10) != 0) {
        pLVar6[-0x58] = 0;
      }
      if ((uVar2 & 0x20) != 0) {
        pLVar6[-0x50] = 0;
      }
      if ((uVar2 & 0x40) != 0) {
        pLVar6[-0x48] = 0;
      }
      if ((uVar2 & 0x80) != 0) {
        pLVar6[-0x40] = 0;
      }
      auVar15 = vporq_avx512f(auVar15,auVar10);
      uVar2 = vpcmpuq_avx512f(auVar15,auVar14,2);
      if ((uVar2 & 1) != 0) {
        pLVar6[-0x38] = 0;
      }
      if ((uVar2 & 2) != 0) {
        pLVar6[-0x30] = 0;
      }
      if ((uVar2 & 4) != 0) {
        pLVar6[-0x28] = 0;
      }
      if ((uVar2 & 8) != 0) {
        pLVar6[-0x20] = 0;
      }
      if ((uVar2 & 0x10) != 0) {
        pLVar6[-0x18] = 0;
      }
      if ((uVar2 & 0x20) != 0) {
        pLVar6[-0x10] = 0;
      }
      if ((uVar2 & 0x40) != 0) {
        pLVar6[-8] = 0;
      }
      if ((uVar2 & 0x80) != 0) {
        *pLVar6 = 0;
      }
      uVar7 = uVar7 + 0x20;
      pLVar6 = pLVar6 + 0x100;
    } while (((lVar9 - lVar8) + 0x1fU & 0xffffffffffffffe0) != uVar7);
  }
  L->stacksize = newsize;
  L->stack_last = pTVar4 + lVar9 + -5;
  L->top = (StkId)(((long)L->top - (long)block) + (long)pTVar4);
  pUVar3 = L->openupval;
  while (pUVar3 != (UpVal *)0x0) {
    pUVar3->v = (TValue *)(((long)pUVar3->v - (long)block) + (long)pTVar4);
    pUVar3 = (pUVar3->u).open.next;
  }
  for (pCVar5 = L->ci; pCVar5 != (CallInfo *)0x0; pCVar5 = pCVar5->previous) {
    pTVar4 = L->stack;
    pCVar5->top = (StkId)(((long)pCVar5->top - (long)block) + (long)pTVar4);
    pCVar5->func = (StkId)(((long)pCVar5->func - (long)block) + (long)pTVar4);
    if ((pCVar5->callstatus & 2) != 0) {
      (pCVar5->u).l.base = (StkId)((long)pTVar4 + ((long)(pCVar5->u).l.base - (long)block));
    }
  }
  return;
}

Assistant:

void luaD_reallocstack (lua_State *L, int newsize) {
  TValue *oldstack = L->stack;
  int lim = L->stacksize;
  lua_assert(newsize <= LUAI_MAXSTACK || newsize == ERRORSTACKSIZE);
  lua_assert(L->stack_last - L->stack == L->stacksize - EXTRA_STACK);
  luaM_reallocvector(L, L->stack, L->stacksize, newsize, TValue);
  for (; lim < newsize; lim++)
    setnilvalue(L->stack + lim); /* erase new segment */
  L->stacksize = newsize;
  L->stack_last = L->stack + newsize - EXTRA_STACK;
  correctstack(L, oldstack);
}